

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O0

void __thiscall
slang::syntax::HierarchicalInstanceSyntax::HierarchicalInstanceSyntax
          (HierarchicalInstanceSyntax *this,InstanceNameSyntax *decl,Token openParen,
          SeparatedSyntaxList<slang::syntax::PortConnectionSyntax> *connections,Token closeParen)

{
  bool bVar1;
  PortConnectionSyntax *pPVar2;
  pointer in_RCX;
  size_t in_RDX;
  SyntaxNode *in_RSI;
  SeparatedSyntaxList<slang::syntax::PortConnectionSyntax> *in_RDI;
  PortConnectionSyntax *child;
  iterator __end2;
  iterator __begin2;
  SeparatedSyntaxList<slang::syntax::PortConnectionSyntax> *__range2;
  SeparatedSyntaxList<slang::syntax::PortConnectionSyntax> *rhs;
  
  rhs = (SeparatedSyntaxList<slang::syntax::PortConnectionSyntax> *)&stack0x00000008;
  SyntaxNode::SyntaxNode((SyntaxNode *)in_RDI,HierarchicalInstance);
  (in_RDI->super_SyntaxListBase).super_SyntaxNode.previewNode = in_RSI;
  (in_RDI->super_SyntaxListBase).childCount = in_RDX;
  (in_RDI->elements)._M_ptr = in_RCX;
  SeparatedSyntaxList<slang::syntax::PortConnectionSyntax>::SeparatedSyntaxList(in_RDI,rhs);
  in_RDI[1].elements._M_extent._M_extent_value =
       (size_t)(rhs->super_SyntaxListBase)._vptr_SyntaxListBase;
  in_RDI[2].super_SyntaxListBase._vptr_SyntaxListBase =
       *(_func_int ***)&(rhs->super_SyntaxListBase).super_SyntaxNode;
  if ((in_RDI->super_SyntaxListBase).super_SyntaxNode.previewNode != (SyntaxNode *)0x0) {
    ((in_RDI->super_SyntaxListBase).super_SyntaxNode.previewNode)->parent = (SyntaxNode *)in_RDI;
  }
  *(SeparatedSyntaxList<slang::syntax::PortConnectionSyntax> **)
   &in_RDI[1].super_SyntaxListBase.super_SyntaxNode = in_RDI;
  SeparatedSyntaxList<slang::syntax::PortConnectionSyntax>::begin
            ((SeparatedSyntaxList<slang::syntax::PortConnectionSyntax> *)0xa2f180);
  SeparatedSyntaxList<slang::syntax::PortConnectionSyntax>::end(in_RDI);
  while( true ) {
    bVar1 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::PortConnectionSyntax>::iterator_base<slang::syntax::PortConnectionSyntax_*>_>
                      ((self_type *)in_RDI,
                       (iterator_base<slang::syntax::PortConnectionSyntax_*> *)rhs);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    pPVar2 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::PortConnectionSyntax>::iterator_base<slang::syntax::PortConnectionSyntax_*>,_false>
             ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::PortConnectionSyntax>::iterator_base<slang::syntax::PortConnectionSyntax_*>,_false>
                          *)0xa2f1bf);
    (pPVar2->super_SyntaxNode).parent = (SyntaxNode *)in_RDI;
    iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::PortConnectionSyntax>::iterator_base<slang::syntax::PortConnectionSyntax_*>,_false>
    ::
    operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::PortConnectionSyntax>::iterator_base<slang::syntax::PortConnectionSyntax_*>_>
              ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::PortConnectionSyntax>::iterator_base<slang::syntax::PortConnectionSyntax_*>,_false>
                *)in_RDI);
  }
  return;
}

Assistant:

HierarchicalInstanceSyntax(InstanceNameSyntax* decl, Token openParen, const SeparatedSyntaxList<PortConnectionSyntax>& connections, Token closeParen) :
        SyntaxNode(SyntaxKind::HierarchicalInstance), decl(decl), openParen(openParen), connections(connections), closeParen(closeParen) {
        if (this->decl) this->decl->parent = this;
        this->connections.parent = this;
        for (auto child : this->connections)
            child->parent = this;
    }